

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O3

void * poll_init(event_base *base)

{
  void *pvVar1;
  
  pvVar1 = event_mm_calloc_(1,0x20);
  if (pvVar1 != (void *)0x0) {
    evsig_init_(base);
    evutil_weakrand_seed_(&base->weakrand_seed,0);
  }
  return pvVar1;
}

Assistant:

static void *
poll_init(struct event_base *base)
{
	struct pollop *pollop;

	if (!(pollop = mm_calloc(1, sizeof(struct pollop))))
		return (NULL);

	evsig_init_(base);

	evutil_weakrand_seed_(&base->weakrand_seed, 0);

	return (pollop);
}